

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall DLevelScript::DoClassifyActor(DLevelScript *this,int tid)

{
  player_t *ppVar1;
  DBot *pDVar2;
  uint uVar3;
  APlayerPawn *pAVar4;
  
  if (tid == 0) {
    pAVar4 = (APlayerPawn *)(this->activator).field_0.p;
    uVar3 = 1;
    if (pAVar4 != (APlayerPawn *)0x0) {
      if (((pAVar4->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
        (this->activator).field_0.p = (AActor *)0x0;
        return 1;
      }
LAB_0050eee6:
      ppVar1 = (pAVar4->super_AActor).player;
      if (ppVar1 == (player_t *)0x0) {
        if (((pAVar4->super_AActor).flags3.Value & 0x2000) != 0) {
          return (uint)((pAVar4->super_AActor).health < 1) * 0x20 + 0x30;
        }
        uVar3 = (uint)(((pAVar4->super_AActor).flags.Value & 0x10000) == 0) * 0x80 + 0x80;
      }
      else {
        uVar3 = (uint)(ppVar1->playerstate == '\x01') * 0x20 + (uint)(ppVar1->mo != pAVar4) * 8 +
                0x22;
        pDVar2 = (ppVar1->Bot).field_0.p;
        if (pDVar2 != (DBot *)0x0) {
          if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            return uVar3 | 4;
          }
          (ppVar1->Bot).field_0.p = (DBot *)0x0;
          return uVar3;
        }
      }
    }
  }
  else {
    uVar3 = 0;
    for (pAVar4 = (APlayerPawn *)AActor::TIDHash[tid & 0x7f]; pAVar4 != (APlayerPawn *)0x0;
        pAVar4 = (APlayerPawn *)(pAVar4->super_AActor).inext) {
      if ((pAVar4->super_AActor).tid == tid) goto LAB_0050eee6;
    }
  }
  return uVar3;
}

Assistant:

int DLevelScript::DoClassifyActor(int tid)
{
	AActor *actor;
	int classify;

	if (tid == 0)
	{
		actor = activator;
		if (actor == NULL)
		{
			return ACTOR_WORLD;
		}
	}
	else
	{
		FActorIterator it(tid);
		actor = it.Next();
	}
	if (actor == NULL)
	{
		return ACTOR_NONE;
	}

	classify = 0;
	if (actor->player != NULL)
	{
		classify |= ACTOR_PLAYER;
		if (actor->player->playerstate == PST_DEAD)
		{
			classify |= ACTOR_DEAD;
		}
		else
		{
			classify |= ACTOR_ALIVE;
		}
		if (actor->player->mo != actor)
		{
			classify |= ACTOR_VOODOODOLL;
		}
		if (actor->player->Bot != NULL)
		{
			classify |= ACTOR_BOT;
		}
	}
	else if (actor->flags3 & MF3_ISMONSTER)
	{
		classify |= ACTOR_MONSTER;
		if (actor->health <= 0)
		{
			classify |= ACTOR_DEAD;
		}
		else
		{
			classify |= ACTOR_ALIVE;
		}
	}
	else if (actor->flags & MF_MISSILE)
	{
		classify |= ACTOR_MISSILE;
	}
	else
	{
		classify |= ACTOR_GENERIC;
	}
	return classify;
}